

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpreter.cpp
# Opt level: O2

void __thiscall Interpreter::parseLexedDataToCommandsVector(Interpreter *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  OpenDataServerCommand *pOVar1;
  AssignVarCommand *pAVar2;
  PrintCommand *pPVar3;
  ConnectCommand *pCVar4;
  DefineVarCommand *pDVar5;
  SleepCommand *pSVar6;
  pointer ppCVar7;
  bool bVar8;
  iterator iVar9;
  mapped_type *pmVar10;
  ostream *poVar11;
  pointer pbVar12;
  char *pcVar13;
  pointer __x;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_230;
  _Vector_base<Command_*,_std::allocator<Command_*>_> local_218;
  undefined1 local_200 [8];
  string command_string;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_180;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_120;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  _Vector_base<Command_*,_std::allocator<Command_*>_> local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_c0;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_a8;
  _Base_ptr local_90;
  string *local_88;
  vector<Command_*,_std::allocator<Command_*>_> *local_80;
  vector<Command_*,_std::allocator<Command_*>_> *local_78;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>_>_>
  *local_70;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *local_68;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_58;
  undefined1 local_50 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command_string_vector;
  
  DataBase::setIsRunning(data,true);
  __x = (this->lexed_data_to_interpret).
        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  local_70 = &this->CMD_DICTIONARY;
  local_90 = &(this->CMD_DICTIONARY)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_58 = &this->condition_vector_string;
  local_78 = &this->while_commands_pointers;
  local_60 = &this->while_strings_vectors;
  local_80 = &this->if_commands_pointers;
  local_68 = &this->if_strings_vectors;
  local_88 = (string *)&this->condition_string;
  do {
    if (__x == (this->lexed_data_to_interpret).
               super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
      DataBase::setIsRunning(data,false);
      std::mutex::lock(&data->sim_var_map_lock);
      std::mutex::lock(&data->in_var_map_lock);
      local_200 = (undefined1  [8])0x2;
      std::this_thread::sleep_for<long,std::ratio<1l,1l>>
                ((duration<long,_std::ratio<1L,_1L>_> *)local_200);
      return;
    }
    std::__cxx11::string::string
              ((string *)local_200,
               (string *)
               (__x->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_50,__x);
    iVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>_>_>
            ::find(&local_70->_M_t,(key_type *)local_200);
    if (iVar9._M_node == local_90) {
switchD_00104e18_caseD_5:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_168,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_50);
      bVar8 = belongToCondition(this,&local_168,&this->assign_var_command->super_Command);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_168);
      if (!bVar8) {
        pAVar2 = this->assign_var_command;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_150,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_50);
        (*(pAVar2->super_Command)._vptr_Command[1])(pAVar2,&local_150);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_150);
        bVar8 = std::mutex::try_lock(&data->sim_var_map_lock);
        pcVar13 = "maps are locked by setSimData";
        if (bVar8) {
          bVar8 = std::mutex::try_lock(&data->in_var_map_lock);
          pcVar13 = "maps are locked by setSimData";
          if (bVar8) {
            (**(this->assign_var_command->super_Command)._vptr_Command)();
            goto LAB_00104f1f;
          }
        }
        goto LAB_00105004;
      }
      goto switchD_00104e18_default;
    }
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Interpreter::simulatorCommand>_>_>
              ::operator[](local_70,(key_type *)local_200);
    switch(*pmVar10) {
    case OPEN_DATA_SERVER:
      pOVar1 = this->open_data_server_command;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&command_string.field_2 + 8),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_50);
      this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&command_string.field_2 + 8);
      (*(pOVar1->super_Command)._vptr_Command[1])(pOVar1,this_00);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(this_00);
      (**(this->open_data_server_command->super_Command)._vptr_Command)();
      pcVar13 = "opening a data server";
      goto LAB_00105004;
    case CONNECT:
      pCVar4 = this->connect_command;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_1c8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_50);
      (*(pCVar4->super_Command)._vptr_Command[1])(pCVar4,&local_1c8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1c8);
      (**(this->connect_command->super_Command)._vptr_Command)();
      pcVar13 = "connecting to the simulator";
LAB_00105004:
      poVar11 = std::operator<<((ostream *)&std::cout,pcVar13);
      std::endl<char,std::char_traits<char>>(poVar11);
      break;
    case DEFINE_VAR:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_1b0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_50);
      bVar8 = belongToCondition(this,&local_1b0,&this->define_var_command->super_Command);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1b0);
      if (bVar8) break;
      pDVar5 = this->define_var_command;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_230,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_50);
      (*(pDVar5->super_Command)._vptr_Command[1])(pDVar5,&local_230);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_230);
      bVar8 = std::mutex::try_lock(&data->sim_var_map_lock);
      pcVar13 = "maps are locked by setSimData";
      if (!bVar8) goto LAB_00105004;
      bVar8 = std::mutex::try_lock(&data->in_var_map_lock);
      pcVar13 = "maps are locked by setSimData";
      if (!bVar8) goto LAB_00105004;
      (**(this->define_var_command->super_Command)._vptr_Command)();
LAB_00104f1f:
      pthread_mutex_unlock((pthread_mutex_t *)&data->sim_var_map_lock);
      pthread_mutex_unlock((pthread_mutex_t *)&data->in_var_map_lock);
      break;
    case PRINT:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_138,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_50);
      bVar8 = belongToCondition(this,&local_138,&this->print_command->super_Command);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_138);
      if (!bVar8) {
        pPVar3 = this->print_command;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_120,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_50);
        (*(pPVar3->super_Command)._vptr_Command[1])(pPVar3);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_120);
        (**(this->print_command->super_Command)._vptr_Command)();
      }
      break;
    case SLEEP:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_198,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_50);
      bVar8 = belongToCondition(this,&local_198,&this->sleep_command->super_Command);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_198);
      if (!bVar8) {
        pSVar6 = this->sleep_command;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_180,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_50);
        (*(pSVar6->super_Command)._vptr_Command[1])(pSVar6);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_180);
        (**(this->sleep_command->super_Command)._vptr_Command)();
      }
      break;
    case ASSIGN:
      goto switchD_00104e18_caseD_5;
    case WHILE:
      this->is_while_command = true;
      goto LAB_0010516a;
    case IF:
      this->is_if_command = true;
      std::__cxx11::string::_M_assign(local_88);
LAB_0010516a:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(local_58,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_50);
      break;
    case END_CONDITION:
      if (this->is_if_command == true) {
        command_string_vector.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)operator_new(0x70);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_d8,local_58);
        std::vector<Command_*,_std::allocator<Command_*>_>::vector
                  ((vector<Command_*,_std::allocator<Command_*>_> *)&local_218,local_80);
        std::
        vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::vector(&local_c0,local_68);
        pbVar12 = command_string_vector.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        IfCommand::IfCommand
                  ((IfCommand *)
                   command_string_vector.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_d8,
                   (vector<Command_*,_std::allocator<Command_*>_> *)&local_218,&local_c0);
        this->if_command = (IfCommand *)pbVar12;
        std::
        vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~vector(&local_c0);
        std::_Vector_base<Command_*,_std::allocator<Command_*>_>::~_Vector_base(&local_218);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_d8);
        (**(this->if_command->super_ConditionParser).super_Command._vptr_Command)();
        if (this->if_command != (IfCommand *)0x0) {
          (*(this->if_command->super_ConditionParser).super_Command._vptr_Command[3])();
          this->if_command = (IfCommand *)0x0;
        }
        std::
        vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::clear(local_68);
        ppCVar7 = (this->if_commands_pointers).
                  super__Vector_base<Command_*,_std::allocator<Command_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((this->if_commands_pointers).super__Vector_base<Command_*,_std::allocator<Command_*>_>.
            _M_impl.super__Vector_impl_data._M_finish != ppCVar7) {
          (this->if_commands_pointers).super__Vector_base<Command_*,_std::allocator<Command_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppCVar7;
        }
      }
      else if (this->is_while_command == true) {
        pbVar12 = (pointer)operator_new(0x70);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_108,local_58);
        std::vector<Command_*,_std::allocator<Command_*>_>::vector
                  ((vector<Command_*,_std::allocator<Command_*>_> *)&local_f0,local_78);
        std::
        vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::vector(&local_a8,local_60);
        command_string_vector.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar12;
        WhileCommand::WhileCommand
                  ((WhileCommand *)pbVar12,&local_108,
                   (vector<Command_*,_std::allocator<Command_*>_> *)&local_f0,&local_a8);
        this->while_command =
             (WhileCommand *)
             command_string_vector.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::
        vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~vector(&local_a8);
        std::_Vector_base<Command_*,_std::allocator<Command_*>_>::~_Vector_base(&local_f0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_108);
        (**(this->while_command->super_ConditionParser).super_Command._vptr_Command)();
        if (this->while_command != (WhileCommand *)0x0) {
          (*(this->while_command->super_ConditionParser).super_Command._vptr_Command[3])();
          this->while_command = (WhileCommand *)0x0;
        }
        std::
        vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::clear(local_60);
        ppCVar7 = (this->while_commands_pointers).
                  super__Vector_base<Command_*,_std::allocator<Command_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((this->while_commands_pointers).
            super__Vector_base<Command_*,_std::allocator<Command_*>_>._M_impl.
            super__Vector_impl_data._M_finish != ppCVar7) {
          (this->while_commands_pointers).super__Vector_base<Command_*,_std::allocator<Command_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppCVar7;
        }
      }
      this->is_if_command = false;
      this->is_while_command = false;
    }
switchD_00104e18_default:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_50);
    std::__cxx11::string::~string((string *)local_200);
    __x = __x + 1;
  } while( true );
}

Assistant:

void Interpreter::parseLexedDataToCommandsVector() {
  int iteration = 0;
  // begin read text (boolean flag)
  data->setIsRunning(true);
  // iterate all the data that came from the lexer
  for (auto it = this->lexed_data_to_interpret.begin(); it !=
      this->lexed_data_to_interpret.end(); ++it, ++iteration) {
    // the keyword we look for to know what will be the suitable command
    string command_string = (*it)[0];
    vector<string> command_string_vector = *it;
    // the key for switch
    int commandEnum;
    // check the keyword
    if (this->CMD_DICTIONARY.find(command_string)
        != this->CMD_DICTIONARY.end()) {
      commandEnum = this->CMD_DICTIONARY[command_string];
    } else {
      commandEnum = ASSIGN;
    }
    // take a vector of strings and Execute it!
    switch (commandEnum) {
      case OPEN_DATA_SERVER: {
        this->open_data_server_command->setParameters(command_string_vector);
        this->open_data_server_command->execute();
        cout << "opening a data server" << endl;
        break;
      }
      case CONNECT: {
        this->connect_command->setParameters(command_string_vector);
        this->connect_command->execute();
        cout << "connecting to the simulator" << endl;
        break;
      }
      case DEFINE_VAR: {
        if (this->belongToCondition(command_string_vector,
                                    this->define_var_command)) {
          break;
        } else {
          this->define_var_command->setParameters(command_string_vector);
          if (data->sim_var_map_lock.try_lock()
              && data->in_var_map_lock.try_lock()) {
            this->define_var_command->execute();
            data->sim_var_map_lock.unlock();
            data->in_var_map_lock.unlock();
          } else {
            cout << "maps are locked by setSimData" << endl;
          }
          break;
        }
      }
      case SLEEP: {
        if (this
            ->belongToCondition(command_string_vector, this->sleep_command)) {
          break;
        } else {
          this->sleep_command->setParameters(command_string_vector);
          this->sleep_command->execute();
          break;
        }
      }
      case ASSIGN: {
        // case it belongs to condition
        if (this->belongToCondition(command_string_vector,
                                    this->assign_var_command)) {
          break;
        } else {
          // case its just to execute
          this->assign_var_command->setParameters(command_string_vector);
          if (data->sim_var_map_lock.try_lock()
              && data->in_var_map_lock.try_lock()) {
            this->assign_var_command->execute();
            // unlock the maps
            data->sim_var_map_lock.unlock();
            data->in_var_map_lock.unlock();
          } else {
            cout << "maps are locked by setSimData" << endl;
          }
          break;
        }
      }
      case PRINT: {
        if (this
            ->belongToCondition(command_string_vector, this->print_command)) {
          break;
        } else {
          this->print_command->setParameters(command_string_vector);
          this->print_command->execute();
          break;
        }
      }
      case WHILE: {
        this->is_while_command = true;
        // need to collect the commands in the vector :)
        this->condition_vector_string = command_string_vector;
        break;
      }
      case IF: {
        // need to collect the commands in the vector :)
        this->is_if_command = true;
        this->condition_string = command_string_vector[1];
        this->condition_vector_string = command_string_vector;
        break;
      }
      case END_CONDITION: {
        // if condition
        if (this->is_if_command) {
          // create a new if
          this->if_command = new IfCommand(this->condition_vector_string,
                                           this->if_commands_pointers,
                                           this->if_strings_vectors);
          // execute it (no set needed)
          this->if_command->execute();
          // delete the if
          if (this->if_command != nullptr) {
            delete (this->if_command);
            this->if_command = nullptr;
          }
          this->if_strings_vectors.clear();
          this->if_commands_pointers.clear();
        }
          // while condition
        else if (this->is_while_command) {
          // create a new while
          this->while_command = new WhileCommand(this->condition_vector_string,
                                                 this->while_commands_pointers,
                                                 this->while_strings_vectors);
          this->while_command->execute();
          // delete the old while
          if (this->while_command != nullptr) {
            delete (this->while_command);
            this->while_command = nullptr;
          }
          this->while_strings_vectors.clear();
          this->while_commands_pointers.clear();
        }
        this->is_if_command = false;
        this->is_while_command = false;
        break;
      }
      default: {
        break;
      }
    }
  }
  // end of text commands
  data->setIsRunning(false);
  data->sim_var_map_lock.lock();
  data->in_var_map_lock.lock();
  // give the threads time to realize its over ... (cuz its so fast)
  std::this_thread::sleep_for(chrono::seconds(2));
}